

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O3

void __thiscall OpenMD::NPA::moveA(NPA *this)

{
  Thermo *this_00;
  Mat3x3d *pMVar1;
  undefined8 *puVar2;
  Snapshot *pSVar3;
  RotationAlgorithm *pRVar4;
  pointer ppSVar5;
  RealType RVar6;
  long lVar7;
  undefined8 uVar8;
  double dVar9;
  uint i_1;
  uint uVar10;
  Molecule *pMVar11;
  Vector3d *pVVar12;
  double dVar13;
  uint i_6;
  long lVar14;
  double *pdVar15;
  pointer pVVar16;
  pointer ppSVar17;
  ulong uVar18;
  uint i_5;
  long lVar19;
  StuntDouble *pSVar20;
  int iVar21;
  MoleculeIterator i;
  Vector<double,_3U> result_2;
  Vector3d vel;
  Vector3d pos;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector3d ji;
  Vector3d sc;
  Vector3d frc;
  Vector3d Tb;
  Vector3d COM;
  MoleculeIterator local_1a0;
  Vector3d local_198;
  double local_180;
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  Vector3d local_98;
  Mat3x3d local_78;
  
  local_1a0._M_node = (_Base_ptr)0x0;
  local_98.super_Vector<double,_3U>.data_[2] = 0.0;
  local_98.super_Vector<double,_3U>.data_[0] = 0.0;
  local_98.super_Vector<double,_3U>.data_[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_178[2] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_158[2] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar6 = Thermo::getTemperature(this_00);
  (this->super_NPT).instaTemp = RVar6;
  Thermo::getPressureTensor(&local_78,this_00);
  pMVar1 = &(this->super_NPT).press;
  if (pMVar1 != &local_78) {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)(&this->eta + -1) + lVar14) =
           *(undefined8 *)
            ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14 + 0x10);
      uVar8 = *(undefined8 *)
               ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14 + 8);
      puVar2 = (undefined8 *)
               ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14);
      *puVar2 = *(undefined8 *)
                 ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar14);
      puVar2[1] = uVar8;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  (this->super_NPT).instaPress =
       (((this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
         data_[0][0] +
         (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
         data_[1][1] +
        (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        [2][2]) * 163882576.0) / 3.0;
  RVar6 = Thermo::getVolume(this_00);
  (this->super_NPT).instaVol = RVar6;
  Thermo::getCom((Vector3d *)&local_78,this_00);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x13])(this);
  pMVar11 = SimInfo::beginMolecule
                      ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                       &local_1a0);
  if (pMVar11 != (Molecule *)0x0) {
    do {
      for (ppSVar17 = (pMVar11->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar17 !=
           (pMVar11->integrableObjects_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish &&
          (pSVar20 = *ppSVar17, pSVar20 != (StuntDouble *)0x0)); ppSVar17 = ppSVar17 + 1) {
        pSVar3 = pSVar20->snapshotMan_->currentSnapshot_;
        lVar14 = *(long *)((long)&(pSVar3->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
        lVar19 = (long)pSVar20->localIndex_ * 0x18;
        pdVar15 = (double *)(lVar14 + lVar19);
        local_178[0] = *pdVar15;
        local_178[1] = pdVar15[1];
        local_178[2] = *(double *)(lVar14 + 0x10 + lVar19);
        lVar14 = *(long *)((long)&(pSVar3->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
        local_b8[2] = *(double *)(lVar14 + 0x10 + lVar19);
        pdVar15 = (double *)(lVar14 + lVar19);
        local_b8[0] = *pdVar15;
        local_b8[1] = pdVar15[1];
        local_180 = pSVar20->mass_;
        (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x10])
                  (this,local_d8,local_178);
        dVar13 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
        local_118[0] = 0.0;
        local_118[1] = 0.0;
        local_118[2] = 0.0;
        lVar14 = 0;
        do {
          local_118[lVar14] = local_b8[lVar14] * ((dVar13 * 0.0004184) / local_180);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        lVar14 = 0;
        do {
          local_138[lVar14] = local_d8[lVar14] * dVar13;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_198.super_Vector<double,_3U>.data_[0] = 0.0;
        local_198.super_Vector<double,_3U>.data_[1] = 0.0;
        local_198.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar14 = 0;
        do {
          local_198.super_Vector<double,_3U>.data_[lVar14] = local_118[lVar14] - local_138[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        lVar14 = 0;
        do {
          local_178[lVar14] = local_198.super_Vector<double,_3U>.data_[lVar14] + local_178[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        pSVar3 = pSVar20->snapshotMan_->currentSnapshot_;
        lVar14 = (long)pSVar20->localIndex_ * 0x18;
        pdVar15 = (double *)
                  (*(long *)((long)&(pSVar3->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_) +
                  lVar14);
        if (pdVar15 != local_178) {
          lVar19 = 0;
          do {
            pdVar15[lVar19] = local_178[lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
        }
        if (pSVar20->objType_ - otDAtom < 2) {
          pVVar12 = (Vector3d *)
                    (lVar14 + *(long *)((long)&(pSVar3->atomData).torque.
                                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                       pSVar20->storage_));
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          if (pVVar12 != &local_198) {
            lVar14 = 0;
            do {
              local_198.super_Vector<double,_3U>.data_[lVar14] =
                   (pVVar12->super_Vector<double,_3U>).data_[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
          }
          StuntDouble::lab2Body(&local_98,pSVar20,&local_198);
          lVar14 = *(long *)((long)&(pSVar20->snapshotMan_->currentSnapshot_->atomData).
                                    angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
          pdVar15 = (double *)(lVar14 + (long)pSVar20->localIndex_ * 0x18);
          local_f8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + (long)pSVar20->localIndex_ * 0x18);
          local_f8[0] = *pdVar15;
          local_f8[1] = pdVar15[1];
          dVar13 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar14 = 0;
          do {
            local_198.super_Vector<double,_3U>.data_[lVar14] =
                 local_98.super_Vector<double,_3U>.data_[lVar14] * dVar13 * 0.0004184;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          lVar14 = 0;
          do {
            local_f8[lVar14] = local_198.super_Vector<double,_3U>.data_[lVar14] + local_f8[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          pRVar4 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rotAlgo_;
          (*pRVar4->_vptr_RotationAlgorithm[2])
                    (SUB84((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt,0),
                     pRVar4,pSVar20,local_f8);
          pdVar15 = (double *)
                    ((long)pSVar20->localIndex_ * 0x18 +
                    *(long *)((long)&(pSVar20->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_))
          ;
          if (pdVar15 != local_f8) {
            lVar14 = 0;
            do {
              pdVar15[lVar14] = local_f8[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
          }
        }
      }
      pMVar11 = SimInfo::nextMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_1a0);
    } while (pMVar11 != (Molecule *)0x0);
  }
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x15])(this);
  (*((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  pMVar11 = SimInfo::beginMolecule
                      ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                       &local_1a0);
  if (pMVar11 != (Molecule *)0x0) {
    iVar21 = 0;
    do {
      ppSVar17 = (pMVar11->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar5 = (pMVar11->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppSVar17 != ppSVar5) && (pSVar20 = *ppSVar17, pSVar20 != (StuntDouble *)0x0)) {
        pVVar16 = (this->super_NPT).oldPos.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar21;
        do {
          iVar21 = iVar21 + 1;
          ppSVar17 = ppSVar17 + 1;
          lVar14 = *(long *)((long)&(pSVar20->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
          pdVar15 = (double *)(lVar14 + (long)pSVar20->localIndex_ * 0x18);
          dVar13 = *pdVar15;
          dVar9 = pdVar15[1];
          (pVVar16->super_Vector<double,_3U>).data_[2] =
               *(double *)(lVar14 + 0x10 + (long)pSVar20->localIndex_ * 0x18);
          (pVVar16->super_Vector<double,_3U>).data_[0] = dVar13;
          (pVVar16->super_Vector<double,_3U>).data_[1] = dVar9;
          if (ppSVar17 == ppSVar5) break;
          pSVar20 = *ppSVar17;
          pVVar16 = pVVar16 + 1;
        } while (pSVar20 != (StuntDouble *)0x0);
      }
      pMVar11 = SimInfo::nextMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_1a0);
    } while (pMVar11 != (Molecule *)0x0);
  }
  if (0 < (this->super_NPT).maxIterNum_) {
    dVar13 = 0.0;
    do {
      local_180 = dVar13;
      pMVar11 = SimInfo::beginMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_1a0);
      if (pMVar11 != (Molecule *)0x0) {
        uVar18 = 0;
        do {
          ppSVar17 = (pMVar11->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((ppSVar17 !=
               (pMVar11->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             (pSVar20 = *ppSVar17, pSVar20 != (StuntDouble *)0x0)) {
            uVar18 = (ulong)(int)uVar18;
            lVar14 = uVar18 * 0x18;
            do {
              pSVar3 = pSVar20->snapshotMan_->currentSnapshot_;
              lVar19 = *(long *)((long)&(pSVar3->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar20->storage_);
              lVar7 = (long)pSVar20->localIndex_ * 0x18;
              pdVar15 = (double *)(lVar19 + lVar7);
              local_178[0] = *pdVar15;
              local_178[1] = pdVar15[1];
              local_178[2] = *(double *)(lVar19 + 0x10 + lVar7);
              lVar19 = *(long *)((long)&(pSVar3->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar20->storage_);
              pdVar15 = (double *)(lVar19 + lVar7);
              local_158[0] = *pdVar15;
              local_158[1] = pdVar15[1];
              local_158[2] = *(double *)(lVar19 + 0x10 + lVar7);
              (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
                [0x12])(this,local_158,&local_78,uVar18 & 0xffffffff,local_d8);
              pVVar16 = (this->super_NPT).oldPos.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar13 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt;
              local_138[0] = 0.0;
              local_138[1] = 0.0;
              local_138[2] = 0.0;
              lVar19 = 0;
              do {
                local_138[lVar19] = local_178[lVar19] + local_d8[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_118[0] = 0.0;
              local_118[1] = 0.0;
              local_118[2] = 0.0;
              lVar19 = 0;
              do {
                local_118[lVar19] = local_138[lVar19] * dVar13;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_198.super_Vector<double,_3U>.data_[0] = 0.0;
              local_198.super_Vector<double,_3U>.data_[1] = 0.0;
              local_198.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar19 = 0;
              do {
                local_198.super_Vector<double,_3U>.data_[lVar19] =
                     *(double *)
                      ((long)(pVVar16->super_Vector<double,_3U>).data_ + lVar19 * 8 + lVar14) +
                     local_118[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_158[2] = local_198.super_Vector<double,_3U>.data_[2];
              local_158[0] = local_198.super_Vector<double,_3U>.data_[0];
              local_158[1] = local_198.super_Vector<double,_3U>.data_[1];
              pdVar15 = (double *)
                        ((long)pSVar20->localIndex_ * 0x18 +
                        *(long *)((long)&(pSVar20->snapshotMan_->currentSnapshot_->atomData).
                                         position.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 pSVar20->storage_));
              if (pdVar15 != local_158) {
                lVar19 = 0;
                do {
                  pdVar15[lVar19] = local_158[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
              }
              uVar18 = uVar18 + 1;
              ppSVar17 = ppSVar17 + 1;
              if (ppSVar17 ==
                  (pMVar11->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              pSVar20 = *ppSVar17;
              lVar14 = lVar14 + 0x18;
            } while (pSVar20 != (StuntDouble *)0x0);
          }
          pMVar11 = SimInfo::nextMolecule
                              ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.
                               info_,&local_1a0);
        } while (pMVar11 != (Molecule *)0x0);
      }
      Rattle::constraintA((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rattle_)
      ;
      uVar10 = SUB84(local_180,0) + 1;
      dVar13 = (double)(ulong)uVar10;
    } while ((int)uVar10 < (this->super_NPT).maxIterNum_);
  }
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x17])(this);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPA::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step  (use chi from previous step here):

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += dt2 * Constants::energyConvert * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve eta a half step

    evolveEtaA();
    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    saveEta();
  }